

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O2

bool mpt::add_items(metatype *to,node *head,relation *relation,logger *out)

{
  uint nlen;
  relation *prVar1;
  bool bVar2;
  int iVar3;
  collection *pcVar4;
  object *this;
  undefined4 extraout_var;
  char *pcVar5;
  char *pcVar6;
  convertable *pcVar7;
  convertable *pcVar8;
  undefined4 extraout_var_01;
  object *poVar9;
  object *this_00;
  collection *pcVar10;
  relation rel;
  size_t len;
  char _func [15];
  char *pos;
  relation *local_48;
  identifier id;
  undefined4 extraout_var_00;
  
  builtin_strncpy(_func,"mpt::add_items",0xf);
  local_48 = relation;
  pcVar4 = &convertable::operator_cast_to_group_(&to->super_convertable)->super_collection;
  this = convertable::operator_cast_to_object_(&to->super_convertable);
  if (pcVar4 != (collection *)0x0 || this != (object *)0x0) {
    for (; head != (node *)0x0; head = head->next) {
      pcVar7 = &head->_meta->super_convertable;
      if ((pcVar7 == (convertable *)0x0 || pcVar4 == (collection *)0x0) ||
         (iVar3 = (*pcVar7->_vptr_convertable[2])(pcVar7), CONCAT44(extraout_var,iVar3) == 0)) {
        pcVar5 = (char *)mpt_node_ident(head);
        if (pcVar5 == (char *)0x0) {
          if (out == (logger *)0x0) {
            return false;
          }
          logger::message(out,_func,3,"%s %p: %s","node",head,"bad element name");
          return false;
        }
        if (this == (object *)0x0) {
LAB_0012dfb2:
          if (pcVar4 != (collection *)0x0) {
            pos = pcVar5;
            pcVar6 = (char *)mpt_convert_key(&pos,0,&len);
            if ((pcVar6 == pcVar5) && (*pcVar6 != '\0')) {
              iVar3 = (*((collection *)&pcVar4->_vptr_collection)->_vptr_collection[3])
                                (pcVar4,pcVar6,(ulong)(uint)len);
              pcVar7 = (convertable *)CONCAT44(extraout_var_00,iVar3);
              if (pcVar7 == (convertable *)0x0) {
                if (out != (logger *)0x0) {
                  rel.super_relation._vptr_relation = (_func_int **)&rel._curr;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&rel,pcVar6,pcVar6 + CONCAT44(len._4_4_,(uint)len));
                  logger::message(out,_func,4,"%s: %s","invalid item type",
                                  rel.super_relation._vptr_relation);
                  std::__cxx11::string::~string((string *)&rel);
                }
              }
              else {
                pcVar5 = (char *)mpt_convert_key(&pos,":",&len);
                if ((pcVar5 == (char *)0x0) || (CONCAT44(len._4_4_,(uint)len) == 0)) {
                  if (out != (logger *)0x0) {
                    logger::message(out,_func,4,"%s","empty item name");
                  }
                }
                else {
                  rel.super_relation._vptr_relation = (_func_int **)&PTR_find_0014d4a8;
                  rel._parent = (relation *)0x0;
                  rel._sep = '.';
                  rel._curr = pcVar4;
                  iVar3 = (**pcVar7->_vptr_convertable)(pcVar7,0,0);
                  pcVar8 = collection::relation::find(&rel,(long)iVar3,pcVar5,(uint)len);
                  nlen = (uint)len;
                  if (pcVar8 == (convertable *)0x0) {
                    while (pcVar6 = (char *)mpt_convert_key(&pos,0,&len), prVar1 = local_48,
                          pcVar6 != (char *)0x0) {
                      if (local_48 == (relation *)0x0) {
                        rel.super_relation._vptr_relation = (_func_int **)&PTR_find_0014d4a8;
                        rel._parent = (relation *)0x0;
                        rel._sep = '.';
                        rel._curr = pcVar4;
                        iVar3 = (**pcVar7->_vptr_convertable)(pcVar7,0,0);
                        pcVar8 = collection::relation::find(&rel,(long)iVar3,pcVar6,(uint)len);
                      }
                      else {
                        iVar3 = (**pcVar7->_vptr_convertable)(pcVar7,0,0);
                        iVar3 = (**prVar1->_vptr_relation)
                                          (prVar1,(long)iVar3,pcVar6,(ulong)(uint)len);
                        pcVar8 = (convertable *)CONCAT44(extraout_var_01,iVar3);
                      }
                      if (pcVar8 == (convertable *)0x0) {
                        if (out != (logger *)0x0) {
                          pcVar5 = identifier::name(&head->ident);
                          rel.super_relation._vptr_relation = (_func_int **)&rel._curr;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&rel,pcVar6,pcVar6 + CONCAT44(len._4_4_,(uint)len));
                          logger::message(out,_func,3,"%s: \'%s\': %s","unable to get parent",pcVar5
                                          ,rel.super_relation._vptr_relation);
                          std::__cxx11::string::~string((string *)&rel);
                        }
                        (*pcVar7->_vptr_convertable[1])();
                        return false;
                      }
                      poVar9 = convertable::operator_cast_to_object_(pcVar8);
                      if ((poVar9 == (object *)0x0) ||
                         (this_00 = convertable::operator_cast_to_object_(pcVar7),
                         this_00 == (object *)0x0)) {
                        (*pcVar7->_vptr_convertable[1])();
                        if (out == (logger *)0x0) {
                          return false;
                        }
                        pcVar5 = identifier::name(&head->ident);
                        rel.super_relation._vptr_relation = (_func_int **)&rel._curr;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&rel,pcVar6,pcVar6 + CONCAT44(len._4_4_,(uint)len));
                        logger::message(out,_func,3,"%s: \'%s\': %s","unable to get inheritance",
                                        pcVar5,rel.super_relation._vptr_relation);
                        std::__cxx11::string::~string((string *)&rel);
                        return false;
                      }
                      object::set(this_00,poVar9,out);
                    }
                    identifier::identifier(&id,0x10);
                    bVar2 = identifier::set_name(&id,pcVar5,nlen);
                    prVar1 = local_48;
                    if (bVar2) {
                      iVar3 = (*((collection *)&pcVar4->_vptr_collection)->_vptr_collection[2])
                                        (pcVar4,&id,pcVar7);
                      if (iVar3 < 0) {
                        (*pcVar7->_vptr_convertable[1])();
                        if (out != (logger *)0x0) {
                          rel.super_relation._vptr_relation = (_func_int **)&rel._curr;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&rel,pcVar5,pcVar5 + (int)nlen);
                          logger::message(out,_func,3,"%s: %s","unable add item",
                                          rel.super_relation._vptr_relation);
                          goto LAB_0012e420;
                        }
                      }
                      else if (head->children != (node *)0x0) {
                        poVar9 = convertable::operator_cast_to_object_(pcVar7);
                        if ((out != (logger *)0x0) && (poVar9 == (object *)0x0)) {
                          logger::message(out,_func,4,"%s (%p): %s",0,pcVar7,"element not an object"
                                         );
                        }
                        if ((prVar1 == (relation *)0x0) ||
                           (pcVar10 = &convertable::operator_cast_to_group_(pcVar7)->
                                       super_collection, pcVar10 == (collection *)0x0)) {
                          bVar2 = add_items((metatype *)pcVar7,head->children,(relation *)0x0,out);
                        }
                        else {
                          rel.super_relation._vptr_relation = (_func_int **)&PTR_find_0014d4a8;
                          rel._parent = prVar1;
                          rel._sep = '.';
                          rel._curr = pcVar10;
                          bVar2 = add_items((metatype *)pcVar7,head->children,&rel.super_relation,
                                            out);
                        }
                        if (bVar2 == false) {
                          identifier::~identifier(&id);
                          return false;
                        }
                      }
                    }
                    else if (out != (logger *)0x0) {
                      rel.super_relation._vptr_relation = (_func_int **)&rel._curr;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&rel,pcVar5,pcVar5 + (int)nlen);
                      logger::message(out,_func,3,"%s: %s","unable add item",
                                      rel.super_relation._vptr_relation);
LAB_0012e420:
                      std::__cxx11::string::~string((string *)&rel);
                    }
                    identifier::~identifier(&id);
                    goto LAB_0012e025;
                  }
                  if (out != (logger *)0x0) {
                    rel.super_relation._vptr_relation = (_func_int **)&rel._curr;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&rel,pcVar5,pcVar5 + CONCAT44(len._4_4_,(uint)len));
                    logger::message(out,_func,4,"%s: %s","conflicting item name",
                                    rel.super_relation._vptr_relation);
                    std::__cxx11::string::~string((string *)&rel);
                  }
                }
                (*pcVar7->_vptr_convertable[1])();
              }
            }
            else if (out != (logger *)0x0) {
              logger::message(out,_func,4,"%s: %s","bad element name",pcVar5);
            }
          }
        }
        else if ((pcVar4 != (collection *)0x0) ||
                (iVar3 = (*this->_vptr_object[1])(this,pcVar5,pcVar7), iVar3 < 0)) {
          if (pcVar7 == (convertable *)0x0) goto LAB_0012dfb2;
          rel.super_relation._vptr_relation = (_func_int **)0x0;
          rel._parent = (relation *)0x0;
          iVar3 = (**pcVar7->_vptr_convertable)(pcVar7,0x19,&rel);
          if ((iVar3 < 0) || (bVar2 = object::set(this,pcVar5,(value *)&rel,out), !bVar2)) {
            pcVar6 = convertable::string(pcVar7);
            object::set(this,pcVar5,pcVar6,out);
          }
        }
      }
      else {
        rel.super_relation._vptr_relation = (_func_int **)pcVar7;
        iVar3 = (*((collection *)&pcVar4->_vptr_collection)->_vptr_collection[2])
                          (pcVar4,&head->ident,pcVar7);
        if (iVar3 < 0) {
          rel.super_relation._vptr_relation = (_func_int **)0x0;
        }
        else if (out != (logger *)0x0) {
          logger::message(out,_func,4,"%s %p: %s","group",pcVar4,"failed to add object");
        }
        reference<mpt::metatype>::~reference((reference<mpt::metatype> *)&rel);
      }
LAB_0012e025:
    }
  }
  return true;
}

Assistant:

bool add_items(metatype &to, const node *head, const relation *relation, logger *out)
{
	const char _func[] = "mpt::add_items";
	group *grp = to;
	object *obj = to;
	
	// no assignable target
	if (!grp && !obj) {
		return true;
	}
	
	for (; head; head = head->next) {
		metatype *from = head->_meta;
		
		if (grp && from && from->addref()) {
			reference<metatype> m;
			m.set_instance(from);
			if (grp->append(&head->ident, from) < 0) {
				m.detach();
			}
			else if (out) {
				out->message(_func, out->Warning, "%s %p: %s",
				             MPT_tr("group"), grp, MPT_tr("failed to add object"));
			}
			continue;
		}
		// name is property
		const char *name;
		
		if (!(name = mpt_node_ident(head))) {
			if (out) {
				out->message(_func, out->Error, "%s %p: %s",
				             MPT_tr("node"), head, MPT_tr("bad element name"));
			}
			return false;
		}
		// set property
		if (obj) {
			if (!grp) {
				if (obj->set_property(name, from) >= 0) {
					continue;
				}
			}
			if (from) {
				value val;
				
				if (from->get(val)) {
					if (obj->set(name, val, out)) {
						continue;
					}
				}
				obj->set(name, from->string(), out);
				continue;
			}
		}
		if (!grp) {
			continue;
		}
		// get item type
		const char *start, *pos;
		size_t len;
		start = pos = name;
		name = mpt_convert_key(&pos, 0, &len);
		if (!name || name != start || !*name) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("bad element name"), start);
			}
			continue;
		}
		// create item
		if (!(from = grp->create(name, len))) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("invalid item type"), std::string(name, len).c_str());
			}
			continue;
		}
		// get item name
		name = mpt_convert_key(&pos, ":", &len);
		
		if (!name || !len) {
			if (out) {
				out->message(_func, out->Warning, "%s",
				             MPT_tr("empty item name"));
			}
			from->unref();
			continue;
		}
		// name conflict on same level
		if (collection::relation(*grp).find(from->type(), name, len)) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("conflicting item name"), std::string(name, len).c_str());
			}
			from->unref();
			continue;
		}
		const char *ident = name;
		int ilen = len;
		
		// find dependant items
		while ((name = mpt_convert_key(&pos, 0, &len))) {
			convertable *curr;
			if (relation) {
				curr = relation->find(from->type(), name, len);
			} else {
				curr = collection::relation(*grp).find(from->type(), name, len);
			}
			if (!curr) {
				if (out) {
					out->message(_func, out->Error, "%s: '%s': %s",
					             MPT_tr("unable to get parent"), head->ident.name(), std::string(name, len).c_str());
				}
				from->unref();
				return false;
			}
			object *obj, *src;
			if ((src = *curr) && (obj = *from)) {
				obj->set(*src, out);
				continue;
			}
			from->unref();
			if (out) {
				out->message(_func, out->Error, "%s: '%s': %s",
				             MPT_tr("unable to get inheritance"), head->ident.name(), std::string(name, len).c_str());
			}
			return false;
		}
		// add item to group
		identifier id;
		if (!id.set_name(ident, ilen)) {
			if (out) {
				out->message(_func, out->Error, "%s: %s",
				             MPT_tr("unable add item"), std::string(ident, ilen).c_str());
			}
			continue;
		}
		if (grp->append(&id, from) < 0) {
			from->unref();
			if (out) {
				out->message(_func, out->Error, "%s: %s",
				             MPT_tr("unable add item"), std::string(ident, ilen).c_str());
			}
			continue;
		}
		// set properties and subitems
		if (!head->children) {
			continue;
		}
		// process child items
		object *curr;
		if (!(curr = *from)) {
			if (out) {
				out->message(_func, out->Warning, "%s (%p): %s",
				             name, from, MPT_tr("element not an object"));
			}
		}
		group *ig;
		if (!relation || !(ig = *from)) {
			if (!(add_items(*from, head->children, 0, out))) {
				return false;
			}
			continue;
		}
		collection::relation rel(*ig, relation);
		if (!(add_items(*from, head->children, &rel, out))) {
			return false;
		}
	}
	return true;
}